

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Interprocedural.cpp
# Opt level: O0

void __thiscall
dg::pta::LLVMPointerGraphBuilder::addArgumentsOperands
          (LLVMPointerGraphBuilder *this,Function *F,CallInst *CI,uint index)

{
  PSNode *this_00;
  _Node_iterator_base<std::pair<const_llvm::Value_*const,_dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>,_false>
  F_00;
  pointer ppVar1;
  long in_RDX;
  PSNode *in_RDI;
  PSNodesSeq *cur;
  iterator it;
  const_arg_iterator E;
  const_arg_iterator A;
  unordered_map<const_llvm::Value_*,_dg::pta::LLVMPointerGraphBuilder::PSNodesSeq,_std::hash<const_llvm::Value_*>,_std::equal_to<const_llvm::Value_*>,_std::allocator<std::pair<const_llvm::Value_*const,_dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>_>_>
  *in_stack_ffffffffffffff98;
  Function *in_stack_ffffffffffffffa0;
  long lVar2;
  CallInst *CI_00;
  PSNode *arg;
  PSNode *local_28;
  
  local_28 = (PSNode *)llvm::Function::arg_begin(in_stack_ffffffffffffffa0);
  this_00 = (PSNode *)llvm::Function::arg_end(in_stack_ffffffffffffffa0);
  for (; local_28 != this_00;
      local_28 = (PSNode *)&(local_28->super_SubgraphNode<dg::pta::PSNode>)._successors) {
    arg = local_28;
    F_00._M_cur = (__node_type *)
                  std::
                  unordered_map<const_llvm::Value_*,_dg::pta::LLVMPointerGraphBuilder::PSNodesSeq,_std::hash<const_llvm::Value_*>,_std::equal_to<const_llvm::Value_*>,_std::allocator<std::pair<const_llvm::Value_*const,_dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>_>_>
                  ::find(in_stack_ffffffffffffff98,(key_type *)0x1b1d4f);
    ppVar1 = std::__detail::
             _Node_iterator<std::pair<const_llvm::Value_*const,_dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>,_false,_false>
             ::operator->((_Node_iterator<std::pair<const_llvm::Value_*const,_dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>,_false,_false>
                           *)0x1b1d5e);
    CI_00 = (CallInst *)&ppVar1->second;
    if (in_RDX == 0) {
      PSNodesSeq::getSingleNode((PSNodesSeq *)0x1b1daf);
      addArgumentOperands((LLVMPointerGraphBuilder *)this_00,(Function *)F_00._M_cur,arg,
                          (uint)((ulong)CI_00 >> 0x20));
    }
    else {
      lVar2 = in_RDX;
      PSNodesSeq::getSingleNode((PSNodesSeq *)0x1b1d83);
      addArgumentOperands((LLVMPointerGraphBuilder *)arg,CI_00,in_RDI,(uint)((ulong)lVar2 >> 0x20));
    }
  }
  return;
}

Assistant:

void LLVMPointerGraphBuilder::addArgumentsOperands(const llvm::Function *F,
                                                   const llvm::CallInst *CI,
                                                   unsigned index) {
    for (auto A = F->arg_begin(), E = F->arg_end(); A != E; ++A, ++index) {
        auto it = nodes_map.find(&*A);
        assert(it != nodes_map.end());
        PSNodesSeq &cur = it->second;

        if (CI) {
            // with func ptr call we know from which
            // call we should take the values
            addArgumentOperands(CI, cur.getSingleNode(), index);
        } else {
            // with regular call just use all calls
            addArgumentOperands(F, cur.getSingleNode(), index);
        }
    }
}